

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O3

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<char_const(&)[6]>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          Type type,char *text,char (*args) [6])

{
  SourceCodeText *o;
  
  o = (SourceCodeText *)0x0;
  createMessage<char_const(&)[6]>
            (__return_storage_ptr__,this,(Category)&stack0xffffffffffffffe8,
             (CodeLocation *)(ulong)category,type,text,(char (*) [6])0x0);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }